

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::write_headers<httplib::Request>
          (detail *this,Stream *strm,Request *info,Headers *headers)

{
  bool bVar1;
  void *__buf;
  ssize_t len;
  char *local_98;
  _Base_ptr local_90;
  ssize_t len_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *x_1;
  const_iterator __end2;
  const_iterator __begin2;
  Headers *__range2_1;
  char *local_60;
  _Base_ptr local_58;
  ssize_t len_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *x;
  const_iterator __end0;
  const_iterator __begin0;
  Headers *__range2;
  ssize_t write_len;
  Headers *headers_local;
  Request *info_local;
  Stream *strm_local;
  
  __range2 = (Headers *)0x0;
  __end0 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(strm + 8));
  x = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(strm + 8));
  while (bVar1 = std::operator!=(&__end0,(_Self *)&x), bVar1) {
    len_1 = (ssize_t)std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&__end0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            len_1,"EXCEPTION_WHAT");
    if (!bVar1) {
      local_60 = (char *)std::__cxx11::string::c_str();
      __range2_1 = (Headers *)std::__cxx11::string::c_str();
      headers = (Headers *)&__range2_1;
      local_58 = (_Base_ptr)
                 Stream::write_format<char_const*,char_const*>
                           ((Stream *)this,"%s: %s\r\n",&local_60,(char **)headers);
      if ((long)local_58 < 0) {
        return (ssize_t)local_58;
      }
      __range2 = (Headers *)(&(__range2->_M_t)._M_impl.field_0x0 + (long)&local_58->_M_color);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end0);
  }
  __end2 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)info);
  x_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)info);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&x_1);
    if (!bVar1) {
      strm_local = (Stream *)Stream::write((Stream *)this,0x189cf3,__buf,(size_t)headers);
      if (-1 < (long)strm_local) {
        strm_local = (Stream *)
                     (&(__range2->_M_t)._M_impl.field_0x0 + (long)&strm_local->_vptr_Stream);
      }
      return (ssize_t)strm_local;
    }
    len_2 = (ssize_t)std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&__end2);
    local_98 = (char *)std::__cxx11::string::c_str();
    len = std::__cxx11::string::c_str();
    headers = (Headers *)&len;
    local_90 = (_Base_ptr)
               Stream::write_format<char_const*,char_const*>
                         ((Stream *)this,"%s: %s\r\n",&local_98,(char **)headers);
    if ((long)local_90 < 0) break;
    __range2 = (Headers *)(&(__range2->_M_t)._M_impl.field_0x0 + (long)&local_90->_M_color);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  return (ssize_t)local_90;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const T &info,
									 const Headers &headers) {
			ssize_t write_len = 0;
			for (const auto &x : info.headers) {
				if (x.first == "EXCEPTION_WHAT") { continue; }
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			for (const auto &x : headers) {
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			auto len = strm.write("\r\n");
			if (len < 0) { return len; }
			write_len += len;
			return write_len;
		}